

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString __thiscall
SimpleString::subStringFromTill(SimpleString *this,char startChar,char lastExcludedChar)

{
  char *pcVar1;
  char in_CL;
  long lVar2;
  long lVar3;
  size_t extraout_RDX;
  size_t sVar4;
  undefined7 in_register_00000031;
  char *pcVar5;
  size_t n;
  long lVar6;
  ulong uVar7;
  SimpleString SVar8;
  
  pcVar1 = *(char **)CONCAT71(in_register_00000031,startChar);
  lVar6 = -2;
  do {
    lVar2 = lVar6 + 2;
    lVar6 = lVar6 + 1;
  } while (pcVar1[lVar2] != '\0');
  if (lVar6 == -1) {
LAB_001338e4:
    this->buffer_ = (char *)0x0;
    this->bufferSize_ = 0;
    copyBufferToNewInternalBuffer(this,"");
    sVar4 = extraout_RDX;
LAB_001338f9:
    SVar8.bufferSize_ = sVar4;
    SVar8.buffer_ = (char *)this;
    return SVar8;
  }
  lVar2 = 0;
  pcVar5 = pcVar1;
  while (*pcVar5 != lastExcludedChar) {
    pcVar5 = pcVar5 + 1;
    lVar3 = lVar2 + lVar6;
    lVar2 = lVar2 + -1;
    if (lVar3 == 0) goto LAB_001338e4;
  }
  if (lVar2 == 1) goto LAB_001338e4;
  sVar4 = -lVar2;
  uVar7 = 0xffffffffffffffff;
  do {
    lVar6 = uVar7 + 1;
    uVar7 = uVar7 + 1;
  } while (pcVar1[lVar6] != '\0');
  if (sVar4 < uVar7) {
    lVar6 = 0;
    do {
      if (pcVar5[lVar6] == in_CL) break;
      lVar2 = lVar6 + sVar4;
      lVar6 = lVar6 + 1;
    } while (lVar2 + 1U < uVar7);
  }
  SVar8 = subString(this,(size_t)CONCAT71(in_register_00000031,startChar),sVar4);
  sVar4 = SVar8.bufferSize_;
  goto LAB_001338f9;
}

Assistant:

SimpleString SimpleString::subStringFromTill(char startChar, char lastExcludedChar) const
{
    size_t beginPos = find(startChar);
    if (beginPos == npos) return "";

    size_t endPos = findFrom(beginPos, lastExcludedChar);
    if (endPos == npos) return subString(beginPos);

    return subString(beginPos, endPos - beginPos);
}